

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O0

void Mpm_ManPrecomputePerms(Mpm_Man_t *p)

{
  char cVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  int *__ptr;
  int *__ptr_00;
  Vec_Int_t *pVVar6;
  Vec_Wrd_t *pVVar7;
  Hsh_IntMan_t *pHVar8;
  abctime aVar9;
  word local_90;
  word uTruth;
  int iVar_1;
  int iVar;
  int Count;
  char t;
  abctime clk;
  Vec_Int_t *vVars;
  int Num;
  int OneCopy;
  int One;
  int x;
  int k;
  int i;
  int *pPerm;
  int *pComp;
  int nPerms;
  int nClasses [7];
  int nVars;
  Mpm_Man_t *p_local;
  
  iVar2 = Extra_Factorial(6);
  aVar5 = Abc_Clock();
  if (p->pDsd6 != (Mpm_Dsd_t *)0x0) {
    __assert_fail("p->pDsd6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x2fe,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  p->pDsd6 = s_DsdClass6;
  __ptr = Extra_GreyCodeSchedule(6);
  __ptr_00 = Extra_PermSchedule(6);
  pVVar6 = Vec_IntStartFull(0x40000);
  p->vMap2Perm = pVVar6;
  Num = 0;
  for (OneCopy = 0; iVar4 = Num, OneCopy < 6; OneCopy = OneCopy + 1) {
    p->Perm6[0][OneCopy] = (char)OneCopy;
    Num = OneCopy << ((char)OneCopy * '\x03' & 0x1fU) | Num;
  }
  for (One = 0; One < iVar2; One = One + 1) {
    if (0 < One) {
      for (OneCopy = 0; OneCopy < 6; OneCopy = OneCopy + 1) {
        p->Perm6[One][OneCopy] = p->Perm6[One + -1][OneCopy];
      }
    }
    cVar1 = p->Perm6[One][__ptr_00[One]];
    p->Perm6[One][__ptr_00[One]] = p->Perm6[One][__ptr_00[One] + 1];
    p->Perm6[One][__ptr_00[One] + 1] = cVar1;
    uVar3 = (Num >> ((char)__ptr_00[One] * '\x03' & 0x1fU) ^
            Num >> (((char)__ptr_00[One] + '\x01') * '\x03' & 0x1fU)) & 7;
    Num = uVar3 << (((char)__ptr_00[One] + '\x01') * '\x03' & 0x1fU) ^
          uVar3 << ((char)__ptr_00[One] * '\x03' & 0x1fU) ^ Num;
    Vec_IntWriteEntry(p->vMap2Perm,Num,One);
  }
  if (iVar4 != Num) {
    __assert_fail("OneCopy == One",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,800,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  pVVar6 = Vec_IntAlloc(6);
  x = 0;
LAB_00b8577d:
  iVar4 = Vec_IntSize(p->vMap2Perm);
  if (iVar4 <= x) {
    Vec_IntFree(pVVar6);
    if (p->vPerm6 != (Vec_Wrd_t *)0x0) {
      __assert_fail("p->vPerm6 == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,0x355,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
    pVVar7 = Vec_WrdAlloc(iVar2 * 0x253);
    p->vPerm6 = pVVar7;
    x = 0;
    while( true ) {
      if (0x252 < x) {
        if (__ptr_00 != (int *)0x0) {
          free(__ptr_00);
        }
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        pHVar8 = Mpm_ManBuildHashTable(&p->vConfgRes);
        p->pHash = pHVar8;
        aVar9 = Abc_Clock();
        Abc_PrintTime(1,"Setting up DSD information",aVar9 - aVar5);
        return;
      }
      local_90 = s_DsdClass6[x].uTruth;
      for (One = 0; One < iVar2; One = One + 1) {
        local_90 = Abc_Tt6SwapAdjacent(local_90,__ptr_00[One]);
        Vec_WrdPush(p->vPerm6,local_90);
      }
      if (local_90 != s_DsdClass6[x].uTruth) break;
      x = x + 1;
    }
    __assert_fail("uTruth == s_DsdClass6[i].uTruth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x35f,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  Vec_IntEntry(p->vMap2Perm,x);
  iVar_1 = 0;
  Num = x;
  Vec_IntFill(pVVar6,6,0);
  One = 0;
  do {
    if ((5 < One) || ((uVar3 = x >> ((char)One * '\x03' & 0x1fU) & 7, 5 < uVar3 && (uVar3 < 7))))
    break;
    if (uVar3 != 7) {
      iVar4 = Vec_IntEntry(pVVar6,uVar3);
      if (iVar4 == 1) break;
      Vec_IntWriteEntry(pVVar6,uVar3,1);
      iVar_1 = iVar_1 + 1;
    }
    One = One + 1;
  } while( true );
  if ((5 < One) && (iVar_1 != 6)) {
    OneCopy = 0;
    for (One = 0; One < 6; One = One + 1) {
      iVar4 = Vec_IntEntry(pVVar6,One);
      if (iVar4 == 0) {
        Vec_IntWriteEntry(pVVar6,OneCopy,One);
        OneCopy = OneCopy + 1;
      }
    }
    Vec_IntShrink(pVVar6,OneCopy);
    OneCopy = 0;
    for (One = 0; One < 6; One = One + 1) {
      if ((Num >> ((char)One * '\x03' & 0x1fU) & 7U) == 7) {
        uVar3 = Vec_IntEntry(pVVar6,OneCopy);
        Num = (uVar3 ^ 7) << ((char)One * '\x03' & 0x1fU) ^ Num;
        OneCopy = OneCopy + 1;
      }
    }
    iVar4 = Vec_IntSize(pVVar6);
    if (OneCopy != iVar4) {
      __assert_fail("x == Vec_IntSize(vVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,0x346,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
    iVar4 = Vec_IntEntry(p->vMap2Perm,Num);
    if (iVar4 == -1) {
      __assert_fail("Vec_IntEntry( p->vMap2Perm, One ) != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,0x348,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
    p_00 = p->vMap2Perm;
    iVar4 = Vec_IntEntry(p->vMap2Perm,Num);
    Vec_IntWriteEntry(p_00,x,iVar4);
  }
  x = x + 1;
  goto LAB_00b8577d;
}

Assistant:

void Mpm_ManPrecomputePerms( Mpm_Man_t * p )
{
    int nVars = 6;
    // 0(1:1) 1(2:1) 2(4:2) 3(10:6) 4(33:23) 5(131:98) 6(595:464)
    int nClasses[7] = { 1, 2, 4, 10, 33, 131, 595 };
    int nPerms = Extra_Factorial( nVars );
//    int nSwaps = (1 << nVars);
    int * pComp, * pPerm;
    int i, k, x, One, OneCopy, Num;
    Vec_Int_t * vVars;
    abctime clk = Abc_Clock();
    assert( p->pDsd6 == NULL );
    p->pDsd6 = s_DsdClass6;
    // precompute schedules
    pComp = Extra_GreyCodeSchedule( nVars );
    pPerm = Extra_PermSchedule( nVars );
    // map numbers into perms
    p->vMap2Perm = Vec_IntStartFull( (1<<(3*nVars)) );
    // store permutations
    One = 0;
    for ( x = 0; x < nVars; x++ )
    {
        p->Perm6[0][x] = (char)x;
        One |= (x << (3*x));
    }
//    Vec_IntWriteEntry( p->vMap2Perm, One, 0 );
    OneCopy = One;
    for ( k = 0; k < nPerms; k++ )
    {
        if ( k > 0 )
        for ( x = 0; x < nVars; x++ )
            p->Perm6[k][x] = p->Perm6[k-1][x];
        ABC_SWAP( char, p->Perm6[k][pPerm[k]], p->Perm6[k][pPerm[k]+1] );

        Num = ( (One >> (3*(pPerm[k]  ))) ^ (One >> (3*(pPerm[k]+1))) ) & 7;
        One ^=  (Num << (3*(pPerm[k]  )));
        One ^=  (Num << (3*(pPerm[k]+1)));

        Vec_IntWriteEntry( p->vMap2Perm, One, k );
        
//        Mpm_ManPrintPerm( One );
//        for ( x = 0; x < nVars; x++ )
//            printf( "%d ", p->Perm6[k][x] );
//        printf( "\n" );
    }
    assert( OneCopy == One );
    // fill in the gaps
    vVars = Vec_IntAlloc( 6 );
    Vec_IntForEachEntry( p->vMap2Perm, Num, i )
    {
        // mark used variables
        int Count = 0;
        One = i;
        Vec_IntFill( vVars, 6, 0 );
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar >= nVars && iVar < 7 )
                break;
            if ( iVar != 7 )
            {
                if ( Vec_IntEntry( vVars, iVar ) == 1 )
                    break;
                Vec_IntWriteEntry( vVars, iVar, 1 );
                Count++;
            }
        }
        // skip ones with dups and complete
        if ( k < nVars || Count == nVars )
            continue;
        // find unused variables
        for ( x = k = 0; k < 6; k++ )
            if ( Vec_IntEntry(vVars, k) == 0 )
                Vec_IntWriteEntry( vVars, x++, k );
        Vec_IntShrink( vVars, x );
        // fill in used variables
        x = 0;
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar == 7 )
                One ^= ((Vec_IntEntry(vVars, x++) ^ 7) << (3*k));
        }
        assert( x == Vec_IntSize(vVars) );
        // save this one
        assert( Vec_IntEntry( p->vMap2Perm, One ) != -1 );
        Vec_IntWriteEntry( p->vMap2Perm, i, Vec_IntEntry(p->vMap2Perm, One) );
/*
        // mapping
        Mpm_ManPrintPerm( i );
        printf( "->  " );
        Mpm_ManPrintPerm( One );
        printf( "\n" );
*/
    }
    Vec_IntFree( vVars );

    // store permuted truth tables
    assert( p->vPerm6 == NULL );
    p->vPerm6 = Vec_WrdAlloc( nPerms * 595 );
    for ( i = 0; i < nClasses[nVars]; i++ )
    {
        word uTruth = s_DsdClass6[i].uTruth;
        for ( k = 0; k < nPerms; k++ )
        {
            uTruth = Abc_Tt6SwapAdjacent( uTruth, pPerm[k] );
            Vec_WrdPush( p->vPerm6, uTruth );
        }
        assert( uTruth == s_DsdClass6[i].uTruth );
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // build hash table
    p->pHash = Mpm_ManBuildHashTable( &p->vConfgRes );
    Abc_PrintTime( 1, "Setting up DSD information", Abc_Clock() - clk );
}